

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix.cc
# Opt level: O3

void __thiscall fmt::v5::file::file(file *this,char *param_2,int param_3)

{
  int iVar1;
  int *piVar2;
  system_error *this_00;
  string_view message;
  char *local_28;
  
  do {
    iVar1 = open(param_2,param_3,0x180);
    this->fd_ = iVar1;
    if (iVar1 != -1) {
      return;
    }
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  this_00 = (system_error *)__cxa_allocate_exception(0x18);
  message.size_ = 0x13;
  message.data_ = "cannot open file {}";
  local_28 = param_2;
  system_error::system_error<char_const*>(this_00,*piVar2,message,&local_28);
  __cxa_throw(this_00,&system_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

file::file(cstring_view path, int oflag) {
  int mode = S_IRUSR | S_IWUSR;
#if defined(_WIN32) && !defined(__MINGW32__)
  fd_ = -1;
  FMT_POSIX_CALL(sopen_s(&fd_, path.c_str(), oflag, _SH_DENYNO, mode));
#else
  FMT_RETRY(fd_, FMT_POSIX_CALL(open(path.c_str(), oflag, mode)));
#endif
  if (fd_ == -1)
    FMT_THROW(system_error(errno, "cannot open file {}", path.c_str()));
}